

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedForward.h
# Opt level: O0

int kwsys_shared_forward_fullpath(char *self_path,char *in_path,char *result,char *desc)

{
  int iVar1;
  char local_2038 [8];
  char msgbuf [4096];
  char temp_path [4096];
  char *desc_local;
  char *result_local;
  char *in_path_local;
  char *self_path_local;
  
  if (*in_path == '/') {
    strcpy(result,in_path);
  }
  else {
    strcpy(msgbuf + 0xff8,self_path);
    strcat(msgbuf + 0xff8,"/");
    strcat(msgbuf + 0xff8,in_path);
    iVar1 = kwsys_shared_forward_realpath(msgbuf + 0xff8,result);
    if (iVar1 == 0) {
      if (desc != (char *)0x0) {
        kwsys_shared_forward_strerror(local_2038);
        fprintf(_stderr,"Error converting %s \"%s\" to real path: %s\n",desc,msgbuf + 0xff8,
                local_2038);
      }
      return 0;
    }
  }
  return 1;
}

Assistant:

static int kwsys_shared_forward_fullpath(const char* self_path,
                                         const char* in_path, char* result,
                                         const char* desc)
{
  /* Check the specified path type.  */
  if (in_path[0] == '/') {
    /* Already a full path.  */
    strcpy(result, in_path);
  }
#if defined(_WIN32)
  else if (in_path[0] && in_path[1] == ':') {
    /* Already a full path.  */
    strcpy(result, in_path);
  }
#endif
  else {
    /* Relative to self path.  */
    char temp_path[KWSYS_SHARED_FORWARD_MAXPATH];
    strcpy(temp_path, self_path);
    strcat(temp_path, kwsys_shared_forward_path_slash);
    strcat(temp_path, in_path);
    if (!kwsys_shared_forward_realpath(temp_path, result)) {
      if (desc) {
        char msgbuf[KWSYS_SHARED_FORWARD_MAXPATH];
        kwsys_shared_forward_strerror(msgbuf);
        fprintf(stderr, "Error converting %s \"%s\" to real path: %s\n", desc,
                temp_path, msgbuf);
      }
      return 0;
    }
  }